

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_command_runner.cc
# Opt level: O0

void __thiscall
PosixCommandRunner::RunCommand
          (PosixCommandRunner *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command)

{
  pointer this_00;
  bool bVar1;
  int iVar2;
  char *__file;
  char **__argv;
  value_type local_70 [3];
  value_type local_58;
  reference local_50;
  string *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<char_*,_std::allocator<char_*>_> args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  PosixCommandRunner *this_local;
  
  args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)command;
  if (this->current_process_ != -1) {
    __assert_fail("current_process_ == -1 && \"Previous command is still running\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/posix_command_runner.cc"
                  ,0x2f,
                  "virtual void PosixCommandRunner::RunCommand(const std::vector<std::string> &)");
  }
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)&__range1);
  this_00 = args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  arg = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&arg), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    local_58 = (value_type)std::__cxx11::string::c_str();
    std::vector<char_*,_std::allocator<char_*>_>::push_back
              ((vector<char_*,_std::allocator<char_*>_> *)&__range1,&local_58);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  local_70[0] = (value_type)0x0;
  std::vector<char_*,_std::allocator<char_*>_>::push_back
            ((vector<char_*,_std::allocator<char_*>_> *)&__range1,local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0);
  __file = (char *)std::__cxx11::string::c_str();
  __argv = std::vector<char_*,_std::allocator<char_*>_>::data
                     ((vector<char_*,_std::allocator<char_*>_> *)&__range1);
  iVar2 = posix_spawnp(&this->current_process_,__file,(posix_spawn_file_actions_t *)0x0,
                       (posix_spawnattr_t *)0x0,__argv,_environ);
  if (iVar2 != 0) {
    this->current_process_ = -1;
    this->previous_command_failed_ = true;
  }
  this->previous_command_failed_ = false;
  std::vector<char_*,_std::allocator<char_*>_>::~vector
            ((vector<char_*,_std::allocator<char_*>_> *)&__range1);
  return;
}

Assistant:

void PosixCommandRunner::RunCommand(const std::vector<std::string>& command) {
  assert(current_process_ == -1 && "Previous command is still running");

  // Convert argument strings to char *, as expected by posix_spawnp().
  std::vector<char*> args;
  for (const std::string& arg : command)
    args.push_back(const_cast<char*>(arg.c_str()));
  args.push_back(nullptr);

  // Spawn subprocess.
  if (posix_spawnp(&current_process_, command[0].c_str(), nullptr, nullptr,
                   args.data(), environ) != 0) {
    current_process_ = -1;
    previous_command_failed_ = true;
  }
  previous_command_failed_ = false;
}